

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O3

Vec_Ptr_t * Scl_LibertyReadPinTimingAll(Scl_Tree_t *p,Scl_Item_t *pPinOut,char *pNameIn)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  char *__s1;
  long lVar7;
  Scl_Item_t *pSVar8;
  int iVar9;
  Scl_Item_t *pSVar10;
  ulong local_48;
  
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nCap = 0x10;
  pVVar5->nSize = 0;
  ppvVar6 = (void **)malloc(0x80);
  pVVar5->pArray = ppvVar6;
  uVar1 = pPinOut->Child;
  iVar4 = p->nItems;
  if ((int)uVar1 < iVar4) {
    if ((-1 < (int)uVar1) && (p->pItems != (Scl_Item_t *)0x0)) {
      pSVar8 = p->pItems + uVar1;
      iVar9 = 0;
      local_48 = 0x10;
      do {
        iVar3 = (pSVar8->Key).Beg;
        iVar2 = (pSVar8->Key).End - iVar3;
        iVar3 = strncmp(p->pContents + iVar3,"timing",(long)iVar2);
        if (iVar2 == 6 && iVar3 == 0) {
          uVar1 = pSVar8->Child;
          if (iVar4 <= (int)uVar1) goto LAB_003d1a8b;
          if ((-1 < (int)uVar1) && (p->pItems != (Scl_Item_t *)0x0)) {
            pSVar10 = p->pItems + uVar1;
            do {
              iVar4 = (pSVar10->Key).Beg;
              iVar3 = (pSVar10->Key).End - iVar4;
              iVar4 = strncmp(p->pContents + iVar4,"related_pin",(long)iVar3);
              if (iVar3 == 0xb && iVar4 == 0) {
                __s1 = Scl_LibertyReadString(p,pSVar10->Head);
                iVar4 = strcmp(__s1,pNameIn);
                if (iVar4 == 0) {
                  iVar4 = (int)local_48;
                  if (iVar9 == iVar4) {
                    if (iVar4 < 0x10) {
                      if (pVVar5->pArray == (void **)0x0) {
                        ppvVar6 = (void **)malloc(0x80);
                      }
                      else {
                        ppvVar6 = (void **)realloc(pVVar5->pArray,0x80);
                      }
                      pVVar5->pArray = ppvVar6;
                      pVVar5->nCap = 0x10;
                      local_48 = 0x10;
                    }
                    else {
                      local_48 = (ulong)(uint)(iVar4 * 2);
                      if (pVVar5->pArray == (void **)0x0) {
                        ppvVar6 = (void **)malloc(local_48 * 8);
                      }
                      else {
                        ppvVar6 = (void **)realloc(pVVar5->pArray,local_48 * 8);
                      }
                      pVVar5->pArray = ppvVar6;
                      pVVar5->nCap = iVar4 * 2;
                    }
                  }
                  else {
                    ppvVar6 = pVVar5->pArray;
                  }
                  lVar7 = (long)iVar9;
                  iVar9 = iVar9 + 1;
                  pVVar5->nSize = iVar9;
                  ppvVar6[lVar7] = pSVar8;
                }
              }
              uVar1 = pSVar10->Next;
              iVar4 = p->nItems;
              if (iVar4 <= (int)uVar1) goto LAB_003d1a8b;
            } while ((-1 < (int)uVar1) &&
                    (pSVar10 = p->pItems + uVar1, p->pItems != (Scl_Item_t *)0x0));
          }
        }
        uVar1 = pSVar8->Next;
        if (iVar4 <= (int)uVar1) goto LAB_003d1a8b;
      } while ((-1 < (int)uVar1) && (pSVar8 = p->pItems + uVar1, p->pItems != (Scl_Item_t *)0x0));
    }
    return pVVar5;
  }
LAB_003d1a8b:
  __assert_fail("v < p->nItems",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                ,0x4c,"Scl_Item_t *Scl_LibertyItem(Scl_Tree_t *, int)");
}

Assistant:

Vec_Ptr_t * Scl_LibertyReadPinTimingAll( Scl_Tree_t * p, Scl_Item_t * pPinOut, char * pNameIn )
{
    Vec_Ptr_t * vTimings;
    Scl_Item_t * pTiming, * pPinIn;
    vTimings = Vec_PtrAlloc( 16 );
    Scl_ItemForEachChildName( p, pPinOut, pTiming, "timing" )
        Scl_ItemForEachChildName( p, pTiming, pPinIn, "related_pin" )
            if ( !strcmp(Scl_LibertyReadString(p, pPinIn->Head), pNameIn) )
                Vec_PtrPush( vTimings, pTiming );
    return vTimings;
}